

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O1

Instr * Lowerer::GetLdSpreadIndicesInstr(Instr *instr)

{
  Opnd *this;
  _func_int **pp_Var1;
  code *pcVar2;
  OpndKind OVar3;
  bool bVar4;
  undefined4 *puVar5;
  Instr *pIVar6;
  
  this = instr->m_src2;
  OVar3 = IR::Opnd::GetKind(this);
  if (OVar3 == OpndKindSym) {
    OVar3 = IR::Opnd::GetKind(this);
    if (OVar3 != OpndKindSym) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x45,"(this->IsSymOpnd())","Bad call to AsSymOpnd()");
      if (!bVar4) goto LAB_005f1efa;
      *puVar5 = 0;
    }
    pp_Var1 = this[1]._vptr_Opnd;
    if (*(char *)((long)pp_Var1 + 0x14) != '\x01') {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                         ,0x1f,"(this->IsStackSym())","Bad call to AsStackSym()");
      if (!bVar4) goto LAB_005f1efa;
      *puVar5 = 0;
    }
    if ((((ulong)pp_Var1[3] & 1) == 0) || (pp_Var1[5] == (_func_int *)0x0)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x6cb0,"(argLinkSym->IsSingleDef())","argLinkSym->IsSingleDef()");
      if (!bVar4) {
LAB_005f1efa:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar5 = 0;
    }
    pIVar6 = (Instr *)pp_Var1[5];
  }
  else {
    pIVar6 = (Instr *)0x0;
  }
  return pIVar6;
}

Assistant:

IR::Instr* Lowerer::GetLdSpreadIndicesInstr(IR::Instr *instr)
{
    IR::Opnd *src2 = instr->GetSrc2();
    if (!src2->IsSymOpnd())
    {
        return nullptr;
    }

    IR::SymOpnd *   argLinkOpnd = src2->AsSymOpnd();
    StackSym *      argLinkSym  = argLinkOpnd->m_sym->AsStackSym();

    Assert(argLinkSym->IsSingleDef());

    return argLinkSym->m_instrDef;
}